

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::MigrateToSQLite(CWallet *this,bilingual_str *error)

{
  long lVar1;
  WalletDatabase *pWVar2;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  __last;
  pointer ppVar3;
  long *plVar4;
  DatabaseBatch *pDVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  WalletDatabase *pWVar9;
  pointer ppVar10;
  long in_FS_OFFSET;
  WalletDatabase *local_168;
  DatabaseStatus db_status;
  vector<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  records;
  long *local_138;
  DatabaseBatch *local_130;
  string_type local_128;
  undefined1 local_108 [24];
  basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> bStack_f0;
  undefined2 local_d0;
  undefined1 local_ce;
  int64_t local_c8;
  SerializeData value;
  path wallet_path;
  path db_path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WalletLogPrintf<>(this,"Migrating wallet storage database from BerkeleyDB to SQLite.\n");
  (*((this->m_database)._M_t.
     super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
     _M_t.
     super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
     super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase[0xd]
  )((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"sqlite");
  std::__cxx11::string::~string((string *)local_108);
  if (bVar7) {
    _((bilingual_str *)local_108,(ConstevalStringLiteral)0x3e5f53);
    bilingual_str::operator=(error,(bilingual_str *)local_108);
    bilingual_str::~bilingual_str((bilingual_str *)local_108);
    bVar7 = false;
    goto LAB_00154014;
  }
  pWVar9 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  (*pWVar9->_vptr_WalletDatabase[0xe])(&local_130,pWVar9,1);
  (*local_130->_vptr_DatabaseBatch[9])(&local_138);
  records.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  records.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  records.
  super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_138 == (long *)0x0) {
    _((bilingual_str *)local_108,(ConstevalStringLiteral)0x3e5f7a);
LAB_00153e28:
    bilingual_str::operator=(error,(bilingual_str *)local_108);
    bilingual_str::~bilingual_str((bilingual_str *)local_108);
    bVar7 = false;
  }
  else {
    while( true ) {
      local_108._16_8_ = 0;
      bStack_f0._M_dataplus._M_p = (pointer)0x0;
      local_108[0] = false;
      local_108[1] = false;
      local_108._2_2_ = 0;
      local_108._4_4_ = BERKELEY;
      local_108._8_4_ = 0;
      local_108._12_4_ = 0;
      db_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
      db_path.super_path._M_pathname.field_2._8_8_ = 0;
      db_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
      db_path.super_path._M_pathname._M_string_length = 0;
      iVar8 = (**(code **)(*local_138 + 0x10))
                        (local_138,
                         (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_108
                         ,&db_path);
      if (iVar8 != 1) break;
      __last._M_current._4_4_ = local_108._12_4_;
      __last._M_current._0_4_ = local_108._8_4_;
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::
      vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&wallet_path,
                 (byte *)(CONCAT44(local_108._4_4_,CONCAT22(local_108._2_2_,local_108._0_2_)) +
                         (long)bStack_f0._M_dataplus._M_p),__last,(allocator_type *)&value);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::
      vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&value,
                 (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                  )(db_path.super_path._M_pathname._M_dataplus._M_p +
                   db_path.super_path._M_pathname.field_2._8_8_),
                 (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                  )db_path.super_path._M_pathname._M_string_length,(allocator_type *)&local_128);
      std::
      vector<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
      ::
      emplace_back<std::vector<std::byte,zero_after_free_allocator<std::byte>>&,std::vector<std::byte,zero_after_free_allocator<std::byte>>&>
                ((vector<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                  *)&records,
                 (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&wallet_path,
                 (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&wallet_path);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&db_path);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_108);
    }
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&db_path);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_108);
    plVar4 = local_138;
    local_138 = (long *)0x0;
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    pDVar5 = local_130;
    local_130 = (DatabaseBatch *)0x0;
    if (pDVar5 != (DatabaseBatch *)0x0) {
      (*pDVar5->_vptr_DatabaseBatch[5])();
    }
    if (iVar8 != 2) {
      _((bilingual_str *)local_108,(ConstevalStringLiteral)0x3e5fb5);
      goto LAB_00153e28;
    }
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [0xc])(local_108);
    fs::PathFromString(&db_path,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    (*((this->m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->_vptr_WalletDatabase
      [8])();
    std::filesystem::remove((path *)&db_path);
    GetWalletDir();
    fs::PathFromString((path *)&value,&this->m_name);
    fsbridge::AbsPathJoin(&wallet_path,(path *)local_108,(path *)&value);
    std::filesystem::__cxx11::path::~path((path *)&value);
    std::filesystem::__cxx11::path::~path((path *)local_108);
    local_108[0] = false;
    local_108[1] = true;
    local_108._16_8_ = 0;
    bStack_f0._M_dataplus._M_p = (pointer)&bStack_f0.field_2;
    bStack_f0._M_string_length = 0;
    bStack_f0.field_2._M_local_buf[0] = '\0';
    local_d0 = 1;
    local_ce = '\0';
    local_c8 = 100;
    local_108._4_4_ = SQLITE;
    local_108._8_4_ = 1;
    MakeDatabase((wallet *)&local_168,&wallet_path,(DatabaseOptions *)local_108,&db_status,error);
    pWVar9 = local_168;
    if (local_168 == (WalletDatabase *)0x0) {
      __assert_fail("new_db",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfaa,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    (this->m_database)._M_t.
    super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t
    .super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = (WalletDatabase *)0x0;
    if (pWVar2 == (WalletDatabase *)0x0) {
      local_168 = (WalletDatabase *)0x0;
      (this->m_database)._M_t.
      super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
      _M_t.
      super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
      .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = pWVar9;
    }
    else {
      (*pWVar2->_vptr_WalletDatabase[1])();
      pWVar9 = local_168;
      pWVar2 = (this->m_database)._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      local_168 = (WalletDatabase *)0x0;
      (this->m_database)._M_t.
      super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
      _M_t.
      super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
      .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = pWVar9;
      if (pWVar2 != (WalletDatabase *)0x0) {
        (*pWVar2->_vptr_WalletDatabase[1])();
        pWVar9 = (this->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      }
    }
    (*pWVar9->_vptr_WalletDatabase[0xe])(&value,pWVar9,1);
    pbVar6 = value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar5 = local_130;
    value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_130 = (DatabaseBatch *)pbVar6;
    if (pDVar5 != (DatabaseBatch *)0x0) {
      (*pDVar5->_vptr_DatabaseBatch[5])();
      if (value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(undefined8 *)
                      value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x28))();
      }
    }
    iVar8 = (*local_130->_vptr_DatabaseBatch[0xb])();
    ppVar3 = records.
             super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((char)iVar8 == '\0') {
      __assert_fail("began",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfb1,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    ppVar10 = records.
              super__Vector_base<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (ppVar10 != ppVar3) {
      value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (ppVar10->first).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
      value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (ppVar10->first).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish +
           -(long)value.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_128._M_dataplus._M_p =
           (pointer)(ppVar10->second).
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_128._M_string_length =
           (long)(ppVar10->second).
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)local_128._M_dataplus._M_p;
      bVar7 = DatabaseBatch::Write<Span<std::byte_const>,Span<std::byte_const>>
                        (local_130,(Span<const_std::byte> *)&value,
                         (Span<const_std::byte> *)&local_128,true);
      ppVar10 = ppVar10 + 1;
      if (!bVar7) {
        (*local_130->_vptr_DatabaseBatch[0xd])();
        (*((this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->
          _vptr_WalletDatabase[8])();
        (*((this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl)->
          _vptr_WalletDatabase[0xc])(&local_128);
        std::filesystem::__cxx11::path::path((path *)&value,&local_128,auto_format);
        std::filesystem::remove((path *)&value);
        std::filesystem::__cxx11::path::~path((path *)&value);
        std::__cxx11::string::~string((string *)&local_128);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                      ,0xfb7,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
      }
    }
    iVar8 = (*local_130->_vptr_DatabaseBatch[0xc])();
    if ((char)iVar8 == '\0') {
      __assert_fail("committed",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xfbb,"bool wallet::CWallet::MigrateToSQLite(bilingual_str &)");
    }
    if (local_168 != (WalletDatabase *)0x0) {
      (*local_168->_vptr_WalletDatabase[1])();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              (&bStack_f0);
    std::filesystem::__cxx11::path::~path(&wallet_path.super_path);
    std::filesystem::__cxx11::path::~path(&db_path.super_path);
    bVar7 = true;
  }
  std::
  vector<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::allocator<std::pair<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~vector(&records);
  if (local_138 != (long *)0x0) {
    (**(code **)(*local_138 + 8))();
  }
  if (local_130 != (DatabaseBatch *)0x0) {
    (*local_130->_vptr_DatabaseBatch[5])();
  }
LAB_00154014:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::MigrateToSQLite(bilingual_str& error)
{
    AssertLockHeld(cs_wallet);

    WalletLogPrintf("Migrating wallet storage database from BerkeleyDB to SQLite.\n");

    if (m_database->Format() == "sqlite") {
        error = _("Error: This wallet already uses SQLite");
        return false;
    }

    // Get all of the records for DB type migration
    std::unique_ptr<DatabaseBatch> batch = m_database->MakeBatch();
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    std::vector<std::pair<SerializeData, SerializeData>> records;
    if (!cursor) {
        error = _("Error: Unable to begin reading all records in the database");
        return false;
    }
    DatabaseCursor::Status status = DatabaseCursor::Status::FAIL;
    while (true) {
        DataStream ss_key{};
        DataStream ss_value{};
        status = cursor->Next(ss_key, ss_value);
        if (status != DatabaseCursor::Status::MORE) {
            break;
        }
        SerializeData key(ss_key.begin(), ss_key.end());
        SerializeData value(ss_value.begin(), ss_value.end());
        records.emplace_back(key, value);
    }
    cursor.reset();
    batch.reset();
    if (status != DatabaseCursor::Status::DONE) {
        error = _("Error: Unable to read all records in the database");
        return false;
    }

    // Close this database and delete the file
    fs::path db_path = fs::PathFromString(m_database->Filename());
    m_database->Close();
    fs::remove(db_path);

    // Generate the path for the location of the migrated wallet
    // Wallets that are plain files rather than wallet directories will be migrated to be wallet directories.
    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(m_name));

    // Make new DB
    DatabaseOptions opts;
    opts.require_create = true;
    opts.require_format = DatabaseFormat::SQLITE;
    DatabaseStatus db_status;
    std::unique_ptr<WalletDatabase> new_db = MakeDatabase(wallet_path, opts, db_status, error);
    assert(new_db); // This is to prevent doing anything further with this wallet. The original file was deleted, but a backup exists.
    m_database.reset();
    m_database = std::move(new_db);

    // Write existing records into the new DB
    batch = m_database->MakeBatch();
    bool began = batch->TxnBegin();
    assert(began); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
    for (const auto& [key, value] : records) {
        if (!batch->Write(Span{key}, Span{value})) {
            batch->TxnAbort();
            m_database->Close();
            fs::remove(m_database->Filename());
            assert(false); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
        }
    }
    bool committed = batch->TxnCommit();
    assert(committed); // This is a critical error, the new db could not be written to. The original db exists as a backup, but we should not continue execution.
    return true;
}